

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall ninx::parser::Parser::parse_value(Parser *this)

{
  int iVar1;
  Variable *this_00;
  string *psVar2;
  Token *pTVar3;
  ParserException *pPVar4;
  string *in_RSI;
  undefined1 local_58 [8];
  string name;
  
  psVar2 = in_RSI + 1;
  iVar1 = TokenReader::check_limiter((TokenReader *)psVar2,'{');
  if (iVar1 == 1) {
    parse_block((Parser *)&name);
  }
  else {
    iVar1 = TokenReader::check_limiter((TokenReader *)psVar2,'(');
    if (iVar1 != 1) {
      pTVar3 = TokenReader::peek_token((TokenReader *)psVar2);
      if (pTVar3 != (Token *)0x0) {
        pTVar3 = TokenReader::peek_token((TokenReader *)psVar2);
        iVar1 = (*pTVar3->_vptr_Token[2])(pTVar3);
        if (iVar1 == 3) {
          pTVar3 = TokenReader::get_token((TokenReader *)psVar2);
          this_00 = (Variable *)
                    __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,
                                   &lexer::token::Variable::typeinfo,0);
          psVar2 = lexer::token::Variable::get_name_abi_cxx11_(this_00);
          std::__cxx11::string::string((string *)&name,(string *)psVar2);
          lexer::token::Variable::get_trailing_spaces(this_00);
          std::make_unique<ninx::parser::element::VariableRead,std::__cxx11::string&,int>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     (int *)&name);
          std::__cxx11::string::~string((string *)&name);
          name._M_dataplus._M_p = (pointer)local_58;
          goto LAB_001406b1;
        }
      }
      pTVar3 = TokenReader::get_token((TokenReader *)psVar2);
      pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&name,"Expected Block or Variable.",(allocator *)local_58);
      exception::ParserException::ParserException(pPVar4,pTVar3,in_RSI,&name);
      __cxa_throw(pPVar4,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
    }
    TokenReader::get_token((TokenReader *)psVar2);
    parse_level_3_expression((Parser *)&name);
    iVar1 = TokenReader::check_limiter((TokenReader *)psVar2,')');
    if (iVar1 != 1) {
      pTVar3 = TokenReader::get_token((TokenReader *)psVar2);
      pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&name,"Expected closing parethesis \')\'",(allocator *)local_58);
      exception::ParserException::ParserException(pPVar4,pTVar3,in_RSI,&name);
      __cxa_throw(pPVar4,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
    }
    TokenReader::get_token((TokenReader *)psVar2);
  }
LAB_001406b1:
  (this->origin)._M_dataplus._M_p = name._M_dataplus._M_p;
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> ninx::parser::Parser::parse_value() {
    std::unique_ptr<Expression> value{nullptr};

    // Check if is a block value or a variable read
    if (reader.check_limiter('{') == 1) {
        value = parse_block();
    } else if (reader.check_limiter('(') == 1) {  // Nested expression
        // Consume the open parenthesis
        reader.get_token();

        value = parse_expression();

        // Check and consume the closing parenthesis
        if (reader.check_limiter(')') != 1) {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin, "Expected closing parethesis ')'");
        }
        reader.get_token();

    } else if (reader.peek_token() != nullptr && reader.peek_token()->get_type() == Type::VARIABLE) {
        // Get the variable name
        auto variable_token {dynamic_cast<ninx::lexer::token::Variable *>(reader.get_token())};
        auto name{variable_token->get_name()};
        value = std::make_unique<ninx::parser::element::VariableRead>(name, variable_token->get_trailing_spaces());
    } else {
        auto error_token{reader.get_token()};
        throw ParserException(error_token, this->origin, "Expected Block or Variable.");
    }

    return std::move(value);
}